

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

void key_callback(GLFWwindow *window,wchar_t key,wchar_t scancode,wchar_t action,wchar_t mods)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  double dVar8;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  dVar8 = glfwGetTime();
  if (key < L'Ā') {
    switch(key) {
    case L' ':
      pcVar6 = "SPACE";
      break;
    case L'\'':
      pcVar6 = "APOSTROPHE";
      break;
    case L',':
      pcVar6 = "COMMA";
      break;
    case L'-':
      pcVar6 = "MINUS";
      break;
    case L'.':
      pcVar6 = "PERIOD";
      break;
    case L'/':
      pcVar6 = "SLASH";
      break;
    case L'0':
      pcVar6 = "0";
      break;
    case L'1':
      pcVar6 = "1";
      break;
    case L'2':
      pcVar6 = "2";
      break;
    case L'3':
      pcVar6 = "3";
      break;
    case L'4':
      pcVar6 = "4";
      break;
    case L'5':
      pcVar6 = "5";
      break;
    case L'6':
      pcVar6 = "6";
      break;
    case L'7':
      pcVar6 = "7";
      break;
    case L'8':
      pcVar6 = "8";
      break;
    case L'9':
      pcVar6 = "9";
      break;
    case L';':
      pcVar6 = "SEMICOLON";
      break;
    case L'=':
      pcVar6 = "EQUAL";
      break;
    case L'A':
      pcVar6 = "A";
      break;
    case L'B':
      pcVar6 = "B";
      break;
    case L'C':
      pcVar6 = "C";
      break;
    case L'D':
      pcVar6 = "D";
      break;
    case L'E':
      pcVar6 = "E";
      break;
    case L'F':
      pcVar6 = "F";
      break;
    case L'G':
      pcVar6 = "G";
      break;
    case L'H':
      pcVar6 = "H";
      break;
    case L'I':
      pcVar6 = "I";
      break;
    case L'J':
      pcVar6 = "J";
      break;
    case L'K':
      pcVar6 = "K";
      break;
    case L'L':
      pcVar6 = "L";
      break;
    case L'M':
      pcVar6 = "M";
      break;
    case L'N':
      pcVar6 = "N";
      break;
    case L'O':
      pcVar6 = "O";
      break;
    case L'P':
      pcVar6 = "P";
      break;
    case L'Q':
      pcVar6 = "Q";
      break;
    case L'R':
      pcVar6 = "R";
      break;
    case L'S':
      pcVar6 = "S";
      break;
    case L'T':
      pcVar6 = "T";
      break;
    case L'U':
      pcVar6 = "U";
      break;
    case L'V':
      pcVar6 = "V";
      break;
    case L'W':
      pcVar6 = "W";
      break;
    case L'X':
      pcVar6 = "X";
      break;
    case L'Y':
      pcVar6 = "Y";
      break;
    case L'Z':
      pcVar6 = "Z";
      break;
    case L'[':
      pcVar6 = "LEFT BRACKET";
      break;
    case L'\\':
      pcVar6 = "BACKSLASH";
      break;
    case L']':
      pcVar6 = "RIGHT BRACKET";
      break;
    case L'`':
      pcVar6 = "GRAVE ACCENT";
      break;
    default:
      if (key == L'¡') {
        pcVar6 = "WORLD 1";
        break;
      }
      if (key == L'¢') {
        pcVar6 = "WORLD 2";
        break;
      }
    case L'!':
    case L'\"':
    case L'#':
    case L'$':
    case L'%':
    case L'&':
    case L'(':
    case L')':
    case L'*':
    case L'+':
    case L':':
    case L'<':
    case L'>':
    case L'?':
    case L'@':
    case L'^':
    case L'_':
switchD_0010757a_caseD_10e:
      pcVar6 = "UNKNOWN";
    }
  }
  else {
    switch(key) {
    case L'Ā':
      pcVar6 = "ESCAPE";
      break;
    case L'ā':
      pcVar6 = "ENTER";
      break;
    case L'Ă':
      pcVar6 = "TAB";
      break;
    case L'ă':
      pcVar6 = "BACKSPACE";
      break;
    case L'Ą':
      pcVar6 = "INSERT";
      break;
    case L'ą':
      pcVar6 = "DELETE";
      break;
    case L'Ć':
      pcVar6 = "RIGHT";
      break;
    case L'ć':
      pcVar6 = "LEFT";
      break;
    case L'Ĉ':
      pcVar6 = "DOWN";
      break;
    case L'ĉ':
      pcVar6 = "UP";
      break;
    case L'Ċ':
      pcVar6 = "PAGE UP";
      break;
    case L'ċ':
      pcVar6 = "PAGE DOWN";
      break;
    case L'Č':
      pcVar6 = "HOME";
      break;
    case L'č':
      pcVar6 = "END";
      break;
    default:
      goto switchD_0010757a_caseD_10e;
    case L'Ę':
      pcVar6 = "CAPS LOCK";
      break;
    case L'ę':
      pcVar6 = "SCROLL LOCK";
      break;
    case L'Ě':
      pcVar6 = "NUM LOCK";
      break;
    case L'ě':
      pcVar6 = "PRINT SCREEN";
      break;
    case L'Ĝ':
      pcVar6 = "PAUSE";
      break;
    case L'Ģ':
      pcVar6 = "F1";
      break;
    case L'ģ':
      pcVar6 = "F2";
      break;
    case L'Ĥ':
      pcVar6 = "F3";
      break;
    case L'ĥ':
      pcVar6 = "F4";
      break;
    case L'Ħ':
      pcVar6 = "F5";
      break;
    case L'ħ':
      pcVar6 = "F6";
      break;
    case L'Ĩ':
      pcVar6 = "F7";
      break;
    case L'ĩ':
      pcVar6 = "F8";
      break;
    case L'Ī':
      pcVar6 = "F9";
      break;
    case L'ī':
      pcVar6 = "F10";
      break;
    case L'Ĭ':
      pcVar6 = "F11";
      break;
    case L'ĭ':
      pcVar6 = "F12";
      break;
    case L'Į':
      pcVar6 = "F13";
      break;
    case L'į':
      pcVar6 = "F14";
      break;
    case L'İ':
      pcVar6 = "F15";
      break;
    case L'ı':
      pcVar6 = "F16";
      break;
    case L'Ĳ':
      pcVar6 = "F17";
      break;
    case L'ĳ':
      pcVar6 = "F18";
      break;
    case L'Ĵ':
      pcVar6 = "F19";
      break;
    case L'ĵ':
      pcVar6 = "F20";
      break;
    case L'Ķ':
      pcVar6 = "F21";
      break;
    case L'ķ':
      pcVar6 = "F22";
      break;
    case L'ĸ':
      pcVar6 = "F23";
      break;
    case L'Ĺ':
      pcVar6 = "F24";
      break;
    case L'ĺ':
      pcVar6 = "F25";
      break;
    case L'ŀ':
      pcVar6 = "KEYPAD 0";
      break;
    case L'Ł':
      pcVar6 = "KEYPAD 1";
      break;
    case L'ł':
      pcVar6 = "KEYPAD 2";
      break;
    case L'Ń':
      pcVar6 = "KEYPAD 3";
      break;
    case L'ń':
      pcVar6 = "KEYPAD 4";
      break;
    case L'Ņ':
      pcVar6 = "KEYPAD 5";
      break;
    case L'ņ':
      pcVar6 = "KEYPAD 6";
      break;
    case L'Ň':
      pcVar6 = "KEYPAD 7";
      break;
    case L'ň':
      pcVar6 = "KEYPAD 8";
      break;
    case L'ŉ':
      pcVar6 = "KEYPAD 9";
      break;
    case L'Ŋ':
      pcVar6 = "KEYPAD DECIMAL";
      break;
    case L'ŋ':
      pcVar6 = "KEYPAD DIVIDE";
      break;
    case L'Ō':
      pcVar6 = "KEYPAD MULTPLY";
      break;
    case L'ō':
      pcVar6 = "KEYPAD SUBTRACT";
      break;
    case L'Ŏ':
      pcVar6 = "KEYPAD ADD";
      break;
    case L'ŏ':
      pcVar6 = "KEYPAD ENTER";
      break;
    case L'Ő':
      pcVar6 = "KEYPAD EQUAL";
      break;
    case L'Ŕ':
      pcVar6 = "LEFT SHIFT";
      break;
    case L'ŕ':
      pcVar6 = "LEFT CONTROL";
      break;
    case L'Ŗ':
      pcVar6 = "LEFT ALT";
      break;
    case L'ŗ':
      pcVar6 = "LEFT SUPER";
      break;
    case L'Ř':
      pcVar6 = "RIGHT SHIFT";
      break;
    case L'ř':
      pcVar6 = "RIGHT CONTROL";
      break;
    case L'Ś':
      pcVar6 = "RIGHT ALT";
      break;
    case L'ś':
      pcVar6 = "RIGHT SUPER";
      break;
    case L'Ŝ':
      pcVar6 = "MENU";
    }
  }
  pcVar4 = get_mods_name(mods);
  if ((uint)action < 3) {
    pcVar5 = (&PTR_anon_var_dwarf_34f_00117d20)[(uint)action];
  }
  else {
    pcVar5 = "caused unknown action";
  }
  printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",dVar8,(ulong)uVar2
         ,(ulong)uVar1,(ulong)(uint)key,(ulong)(uint)scancode,pcVar6,pcVar4,pcVar5);
  if (key == L'C' && action == L'\x01') {
    bVar7 = *(int *)((long)pvVar3 + 0xc) == 0;
    *(uint *)((long)pvVar3 + 0xc) = (uint)bVar7;
    pcVar6 = "disabled";
    if (bVar7) {
      pcVar6 = "enabled";
    }
    printf("(( closing %s ))\n",pcVar6);
    return;
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);

    printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",
           counter++, slot->number, glfwGetTime(), key, scancode,
           get_key_name(key),
           get_mods_name(mods),
           get_action_name(action));

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_C:
        {
            slot->closeable = !slot->closeable;

            printf("(( closing %s ))\n", slot->closeable ? "enabled" : "disabled");
            break;
        }
    }
}